

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_JUnitOutputTest_TestCaseWithTestLocation_Test::
TEST_JUnitOutputTest_TestCaseWithTestLocation_Test
          (TEST_JUnitOutputTest_TestCaseWithTestLocation_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).testCaseRunner =
       (JUnitTestOutputTestRunner *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).junitOutput = (JUnitTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile = (FileForJUnitOutputTests *)0x0;
  TEST_GROUP_CppUTestGroupJUnitOutputTest::TEST_GROUP_CppUTestGroupJUnitOutputTest
            (&this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest);
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0034d6f0;
  return;
}

Assistant:

TEST(JUnitOutputTest, TestCaseWithTestLocation)
{
    junitOutput->setPackageName("packagename");
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname").inFile("MySource.c").onLine(159)
            .end();

    outputFile = fileSystem.file("cpputest_packagename_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"MySource.c\" line=\"159\">\n", outputFile->line(5));
}